

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestChild::~TestChild(TestChild *this)

{
  bool bVar1;
  PromiseArenaMember *node;
  int iVar2;
  __pid_t _Var3;
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 *paVar4;
  Fault f;
  int status;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  int local_1c;
  
  bVar1 = (this->pid).ptr.isSet;
  paVar4 = (anon_union_4_1_a8c68091_for_NullableValue<int>_2 *)0x0;
  if (bVar1 != false) {
    paVar4 = &(this->pid).ptr.field_1;
  }
  if (bVar1 == true) {
    do {
      iVar2 = ::kill(paVar4->value,9);
      if (-1 < iVar2) goto LAB_001e8100;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 == 0) {
LAB_001e8100:
      do {
        _Var3 = waitpid(paVar4->value,&local_1c,0);
        if (-1 < _Var3) goto LAB_001e81c0;
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        local_40.exception = (Exception *)0x0;
        local_38 = 0;
        uStack_30 = 0;
        kj::_::Debug::Fault::init
                  (&local_40,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                  );
        kj::_::Debug::Fault::~Fault(&local_40);
      }
    }
    else {
      local_40.exception = (Exception *)0x0;
      local_38 = 0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      kj::_::Debug::Fault::~Fault(&local_40);
    }
  }
LAB_001e81c0:
  node = &((this->promise).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->promise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  return;
}

Assistant:

~TestChild() noexcept(false) {
    KJ_IF_SOME(p, pid) {
      KJ_SYSCALL(::kill(p, SIGKILL)) { return; }
      int status;
      KJ_SYSCALL(waitpid(p, &status, 0)) { return; }
    }
  }